

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void generateMTFValues(EState *s)

{
  UChar UVar1;
  UChar UVar2;
  UInt32 *pUVar3;
  UChar *pUVar4;
  UInt16 *pUVar5;
  int iVar6;
  int iVar7;
  UChar rtmp2;
  UChar *pUStack_158;
  UChar rll_i;
  UChar *ryy_j;
  UChar rtmp;
  UChar ll_i;
  UInt16 *mtfv;
  UChar *block;
  UInt32 *ptr;
  int local_128;
  Int32 EOB;
  Int32 wr;
  Int32 zPend;
  Int32 j;
  Int32 i;
  UChar yy [256];
  EState *s_local;
  
  pUVar3 = s->ptr;
  pUVar4 = s->block;
  pUVar5 = s->mtfv;
  makeMaps_e(s);
  iVar6 = s->nInUse + 1;
  for (zPend = 0; zPend <= iVar6; zPend = zPend + 1) {
    s->mtfFreq[zPend] = 0;
  }
  local_128 = 0;
  EOB = 0;
  for (zPend = 0; zPend < s->nInUse; zPend = zPend + 1) {
    *(char *)((long)&j + (long)zPend) = (char)zPend;
  }
  for (zPend = 0; zPend < s->nblock; zPend = zPend + 1) {
    wr = pUVar3[zPend] - 1;
    if (wr < 0) {
      wr = s->nblock + wr;
    }
    UVar1 = s->unseqToSeq[pUVar4[wr]];
    if ((UChar)j == UVar1) {
      EOB = EOB + 1;
    }
    else {
      if (0 < EOB) {
        EOB = EOB + -1;
        while( true ) {
          if ((EOB & 1U) == 0) {
            pUVar5[local_128] = 0;
            s->mtfFreq[0] = s->mtfFreq[0] + 1;
          }
          else {
            pUVar5[local_128] = 1;
            s->mtfFreq[1] = s->mtfFreq[1] + 1;
          }
          local_128 = local_128 + 1;
          if (EOB < 2) break;
          EOB = (EOB + -2) / 2;
        }
        EOB = 0;
      }
      ryy_j._6_1_ = j._1_1_;
      j._1_1_ = (UChar)j;
      pUStack_158 = (UChar *)((long)&j + 1);
      while (UVar1 != ryy_j._6_1_) {
        pUStack_158 = pUStack_158 + 1;
        UVar2 = *pUStack_158;
        *pUStack_158 = ryy_j._6_1_;
        ryy_j._6_1_ = UVar2;
      }
      j._0_1_ = ryy_j._6_1_;
      iVar7 = (int)pUStack_158 - (int)&j;
      pUVar5[local_128] = (short)iVar7 + 1;
      local_128 = local_128 + 1;
      iVar7 = iVar7 + 1;
      s->mtfFreq[iVar7] = s->mtfFreq[iVar7] + 1;
    }
  }
  if (0 < EOB) {
    EOB = EOB + -1;
    while( true ) {
      if ((EOB & 1U) == 0) {
        pUVar5[local_128] = 0;
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      else {
        pUVar5[local_128] = 1;
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      local_128 = local_128 + 1;
      if (EOB < 2) break;
      EOB = (EOB + -2) / 2;
    }
  }
  pUVar5[local_128] = (UInt16)iVar6;
  s->mtfFreq[iVar6] = s->mtfFreq[iVar6] + 1;
  s->nMTF = local_128 + 1;
  return;
}

Assistant:

static
void generateMTFValues ( EState* s )
{
   UChar   yy[256];
   Int32   i, j;
   Int32   zPend;
   Int32   wr;
   Int32   EOB;

   /* 
      After sorting (eg, here),
         s->arr1 [ 0 .. s->nblock-1 ] holds sorted order,
         and
         ((UChar*)s->arr2) [ 0 .. s->nblock-1 ] 
         holds the original block data.

      The first thing to do is generate the MTF values,
      and put them in
         ((UInt16*)s->arr1) [ 0 .. s->nblock-1 ].
      Because there are strictly fewer or equal MTF values
      than block values, ptr values in this area are overwritten
      with MTF values only when they are no longer needed.

      The final compressed bitstream is generated into the
      area starting at
         (UChar*) (&((UChar*)s->arr2)[s->nblock])

      These storage aliases are set up in bzCompressInit(),
      except for the last one, which is arranged in 
      compressBlock().
   */
   UInt32* ptr   = s->ptr;
   UChar* block  = s->block;
   UInt16* mtfv  = s->mtfv;

   makeMaps_e ( s );
   EOB = s->nInUse+1;

   for (i = 0; i <= EOB; i++) s->mtfFreq[i] = 0;

   wr = 0;
   zPend = 0;
   for (i = 0; i < s->nInUse; i++) yy[i] = (UChar) i;

   for (i = 0; i < s->nblock; i++) {
      UChar ll_i;
      AssertD ( wr <= i, "generateMTFValues(1)" );
      j = ptr[i]-1; if (j < 0) j += s->nblock;
      ll_i = s->unseqToSeq[block[j]];
      AssertD ( ll_i < s->nInUse, "generateMTFValues(2a)" );

      if (yy[0] == ll_i) { 
         zPend++;
      } else {

         if (zPend > 0) {
            zPend--;
            while (True) {
               if (zPend & 1) {
                  mtfv[wr] = BZ_RUNB; wr++; 
                  s->mtfFreq[BZ_RUNB]++; 
               } else {
                  mtfv[wr] = BZ_RUNA; wr++; 
                  s->mtfFreq[BZ_RUNA]++; 
               }
               if (zPend < 2) break;
               zPend = (zPend - 2) / 2;
            };
            zPend = 0;
         }
         {
            register UChar  rtmp;
            register UChar* ryy_j;
            register UChar  rll_i;
            rtmp  = yy[1];
            yy[1] = yy[0];
            ryy_j = &(yy[1]);
            rll_i = ll_i;
            while ( rll_i != rtmp ) {
               register UChar rtmp2;
               ryy_j++;
               rtmp2  = rtmp;
               rtmp   = *ryy_j;
               *ryy_j = rtmp2;
            };
            yy[0] = rtmp;
            j = ryy_j - &(yy[0]);
            mtfv[wr] = j+1; wr++; s->mtfFreq[j+1]++;
         }

      }
   }

   if (zPend > 0) {
      zPend--;
      while (True) {
         if (zPend & 1) {
            mtfv[wr] = BZ_RUNB; wr++; 
            s->mtfFreq[BZ_RUNB]++; 
         } else {
            mtfv[wr] = BZ_RUNA; wr++; 
            s->mtfFreq[BZ_RUNA]++; 
         }
         if (zPend < 2) break;
         zPend = (zPend - 2) / 2;
      };
      zPend = 0;
   }

   mtfv[wr] = EOB; wr++; s->mtfFreq[EOB]++;

   s->nMTF = wr;
}